

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedLiteralEvaluator.cpp
# Opt level: O0

bool __thiscall
Kernel::InterpretedLiteralEvaluator::TypedEvaluator<Kernel::RationalConstantType>::
trySimplifyUnaryMinus
          (TypedEvaluator<Kernel::RationalConstantType> *this,uint *uminus_functor,TermList *inner,
          TermList *result)

{
  bool bVar1;
  TermList TVar2;
  uint64_t *in_RCX;
  Value cons;
  Interpretation itp;
  Term *t;
  undefined4 in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  Theory *in_stack_ffffffffffffff30;
  RationalConstantType *in_stack_ffffffffffffff38;
  Term *t_00;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  RationalConstantType *in_stack_ffffffffffffff68;
  Theory *in_stack_ffffffffffffff70;
  uint64_t local_78;
  Term local_60;
  Term *local_30;
  uint64_t *local_28;
  byte local_1;
  
  local_28 = in_RCX;
  bVar1 = TermList::isTerm((TermList *)0x87d124);
  if (bVar1) {
    local_30 = TermList::term((TermList *)0x87d13a);
    Term::functor(local_30);
    bVar1 = Theory::isInterpretedFunction
                      ((Theory *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),0);
    if (bVar1) {
      Term::functor(local_30);
      local_60._args[0]._content._4_4_ =
           Theory::interpretFunction(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
      if (local_60._args[0]._content._4_4_ == RAT_UNARY_MINUS) {
        TVar2 = Term::operator[]((Term *)CONCAT44(in_stack_ffffffffffffff2c,
                                                  in_stack_ffffffffffffff28),0);
        *local_28 = TVar2._content;
        local_1 = 1;
      }
      else {
        local_1 = 0;
      }
    }
    else {
      t_00 = &local_60;
      RationalConstantType::RationalConstantType((RationalConstantType *)t_00);
      local_1 = Theory::tryInterpretConstant
                          ((Theory *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                           t_00,in_stack_ffffffffffffff38);
      if ((bool)local_1) {
        RationalConstantType::operator-(in_stack_ffffffffffffff68);
        in_stack_ffffffffffffff30 =
             (Theory *)
             Theory::representConstant(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        TermList::TermList((TermList *)in_stack_ffffffffffffff30,
                           (Term *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        *local_28 = local_78;
        RationalConstantType::~RationalConstantType
                  ((RationalConstantType *)in_stack_ffffffffffffff30);
      }
      RationalConstantType::~RationalConstantType((RationalConstantType *)in_stack_ffffffffffffff30)
      ;
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool trySimplifyUnaryMinus(const unsigned& uminus_functor, const TermList& inner, TermList& result)
  { 
    DEBUG("trySimplifyUnaryMinus(uminus(", inner, "))")
    ASS_EQ(uminus_functor, env.signature->getInterpretingSymbol(number::minusI));
    if (inner.isTerm()) {
      /* complex term */
      auto& t = *inner.term();
      if (theory->isInterpretedFunction(t.functor())) {

        /* interpreted function */
        auto itp = theory->interpretFunction(t.functor());
        switch (itp) {
          case number::minusI:
            ASS_EQ(t.numTermArguments(), 1);
            result = t[0];
            return true;

          // case number::addI:
          //   ASS_EQ(t.numTermArguments(), 2);
          //   result = TermList(Term::create2(t.functor(), 
          //       simplifyUnaryMinus(uminus_functor, t[0]),
          //       simplifyUnaryMinus(uminus_functor, t[1])));
          //   return true; 

          default:
            /* interpreted function for which minus is not handled minus is not handled */
            return false;
        }

      } else {
        /* not an interpreted function */
        Value cons;
        if (theory->tryInterpretConstant(&t, cons)) {
          result = TermList(theory->representConstant(-cons));
          return true;
        } else {
          /* uninterpreted function */
          return false;
        }
      }
    } else {
      /* not a complex term */
      return false;
    }
  }